

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O3

void __thiscall
chrono::ChBodyEasyClusterOfSpheres::SetupBody
          (ChBodyEasyClusterOfSpheres *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *positions,
          vector<double,_std::allocator<double>_> *radii,double density,bool visualize,bool collide,
          shared_ptr<chrono::ChMaterialSurface> *material)

{
  pointer pCVar1;
  pointer pCVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  pointer pdVar9;
  long lVar10;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *pvVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  ChSphereShape *this_00;
  double *pdVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *shape;
  bool bVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  pointer pCVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  shared_ptr<chrono::ChSphereShape> vshape;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> offset_positions;
  ChMatrix33<double> totinertia;
  double local_200;
  double local_1e8;
  double dStack_1e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_1b0;
  shared_ptr<chrono::ChVisualModel> local_198;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_188;
  undefined8 uStack_170;
  element_type *local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_160;
  double local_158;
  double local_150;
  double local_148;
  ulong local_140;
  undefined1 local_138 [40];
  undefined1 auStack_110 [16];
  undefined8 uStack_100;
  double local_f8;
  undefined1 local_e8 [16];
  ChQuaternion<double> local_d8;
  ChFrame<double> local_b8;
  
  pCVar33 = (positions->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (positions->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)pCVar1 - (long)pCVar33 >> 3) * -0x5555555555555555 -
      ((long)(radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3) != 0) {
    __assert_fail("positions.size() == radii.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                  ,0x1ee,
                  "void chrono::ChBodyEasyClusterOfSpheres::SetupBody(std::vector<ChVector<>> &, std::vector<double> &, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                 );
  }
  _local_138 = ZEXT864(0);
  local_f8 = 0.0;
  if (pCVar1 == pCVar33) {
    local_200 = DAT_00b689a8;
    local_1e8 = VNULL;
    dStack_1e0 = DAT_00b689a0;
    pCVar33 = (pointer)0x0;
  }
  else {
    pCVar33 = (pointer)0x0;
    uVar16 = 1;
    uVar14 = 0;
    local_200 = DAT_00b689a8;
    local_1e8 = VNULL;
    dStack_1e0 = DAT_00b689a0;
    do {
      uStack_170 = 0;
      local_188.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = pCVar33;
      dVar20 = pow((radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar14],3.0);
      pCVar1 = (positions->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pCVar2 = (positions->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      uVar17 = (ulong)uVar16;
      uVar16 = uVar16 + 1;
      dVar20 = density * dVar20 * 4.1887902047863905;
      pCVar33 = (pointer)((double)local_188.
                                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + dVar20);
      uVar15 = ((long)pCVar2 - (long)pCVar1 >> 3) * -0x5555555555555555;
      dVar21 = 1.0 / (double)pCVar33;
      local_200 = dVar21 * ((double)local_188.
                                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage * local_200 +
                           dVar20 * pCVar1[uVar14].m_data[2]);
      local_1e8 = dVar21 * ((double)local_188.
                                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage * local_1e8 +
                           dVar20 * pCVar1[uVar14].m_data[0]);
      dStack_1e0 = dVar21 * ((double)local_188.
                                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage * dStack_1e0
                            + dVar20 * pCVar1[uVar14].m_data[1]);
      uVar14 = uVar17;
    } while (uVar17 <= uVar15 && uVar15 - uVar17 != 0);
    if (pCVar2 != pCVar1) {
      pdVar9 = (radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      auVar23 = ZEXT816(0);
      auVar27 = ZEXT816(0);
      uVar16 = 1;
      dVar31 = 0.0;
      dVar21 = 0.0;
      dVar20 = 0.0;
      uStack_170 = 0;
      uVar14 = 0;
      local_188.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = pCVar33;
      do {
        local_140 = auVar27._0_8_;
        local_158 = dVar20;
        local_150 = dVar21;
        local_148 = dVar31;
        local_e8 = auVar23;
        dVar20 = pow(pdVar9[uVar14],3.0);
        auVar7 = _local_138;
        pdVar9 = (radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pCVar33 = (positions->
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar17 = (ulong)uVar16;
        uVar16 = uVar16 + 1;
        auVar23._8_8_ = dStack_1e0;
        auVar23._0_8_ = local_1e8;
        auVar23 = vsubpd_avx(*(undefined1 (*) [16])pCVar33[uVar14].m_data,auVar23);
        auVar27._8_8_ = 0x8000000000000000;
        auVar27._0_8_ = 0x8000000000000000;
        auVar19 = vxorpd_avx512vl(auVar23,auVar27);
        dVar31 = density * dVar20 * 4.1887902047863905;
        auVar27 = vshufpd_avx(auVar23,auVar23,1);
        dVar32 = auVar27._0_8_;
        dVar21 = dVar31 * 0.4 * pdVar9[uVar14] * pdVar9[uVar14];
        auVar34._8_8_ = 0;
        auVar34._0_8_ = dVar32 * dVar32;
        auVar34 = vfmadd231sd_fma(auVar34,auVar23,auVar23);
        dVar5 = pCVar33[uVar14].m_data[2] - local_200;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar5;
        auVar34 = vfmadd231sd_fma(auVar34,auVar28,auVar28);
        auVar35._0_8_ = dVar5 * auVar23._0_8_;
        auVar35._8_8_ = dVar5 * auVar23._8_8_;
        auVar23 = vfnmadd213sd_fma(auVar23,auVar23,auVar34);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar31;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar21;
        auVar23 = vfmadd213sd_fma(auVar23,auVar22,auVar24);
        dVar20 = local_158 + auVar23._0_8_;
        auVar23 = vshufps_avx(auVar19,auVar19,0x4e);
        auVar27 = vfmadd213sd_fma(auVar23,auVar27,auVar34);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar5;
        auVar34 = vfnmadd231sd_fma(auVar34,auVar29,auVar29);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = local_140;
        local_138._0_8_ = dVar20;
        auVar8 = _local_138;
        auVar23 = vfmadd213sd_fma(auVar27,auVar22,auVar24);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar21;
        auVar34 = vfmadd213sd_fma(auVar34,auVar22,auVar25);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar32 * auVar19._0_8_;
        auVar27 = vfmadd231sd_fma(auVar30,auVar22,auVar26);
        dVar21 = local_150 + auVar23._0_8_;
        auVar19._8_8_ = dVar31;
        auVar19._0_8_ = dVar31;
        _auStack_110 = auVar7._40_24_;
        local_138._0_32_ = auVar8._0_32_;
        local_138._32_8_ = dVar21;
        auVar7 = _local_138;
        auVar23 = vfnmadd231pd_fma(local_e8,auVar35,auVar19);
        dVar31 = local_148 + auVar34._0_8_;
        local_138._8_8_ = auVar27._0_8_;
        auVar34 = vshufpd_avx(auVar23,auVar23,1);
        local_138._16_8_ = vmovlpd_avx(auVar23);
        stack0xfffffffffffffee8 = auVar7._32_32_;
        local_138._24_8_ = auVar27._0_8_;
        auStack_110 = auVar34;
        uStack_100 = vmovhpd_avx(auVar23);
        uVar15 = ((long)(positions->
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar33 >> 3) *
                 -0x5555555555555555;
        uVar14 = uVar17;
        pCVar33 = local_188.
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_f8 = dVar31;
      } while (uVar17 <= uVar15 && uVar15 - uVar17 != 0);
    }
  }
  (this->super_ChBody).density = (float)density;
  ChVariablesBodyOwnMass::SetBodyMass(&(this->super_ChBody).variables,(double)pCVar33);
  ChBody::SetInertia(&this->super_ChBody,(ChMatrix33<double> *)local_138);
  shape = positions;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            (&local_1b0,positions);
  auVar6._8_8_ = dStack_1e0;
  auVar6._0_8_ = local_1e8;
  lVar10 = (long)(positions->
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(positions->
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  if (lVar10 != 0) {
    uVar16 = 1;
    pvVar11 = (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
              ((lVar10 >> 3) * -0x5555555555555555);
    pdVar13 = (local_1b0.
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_data + 2;
    do {
      shape = (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
              (ulong)uVar16;
      uVar16 = uVar16 + 1;
      auVar27 = vsubpd_avx(*(undefined1 (*) [16])((ChVector<double> *)(pdVar13 + -2))->m_data,auVar6
                          );
      *(undefined1 (*) [16])((ChVector<double> *)(pdVar13 + -2))->m_data = auVar27;
      *pdVar13 = *pdVar13 - local_200;
      pdVar13 = pdVar13 + 3;
    } while (shape <= pvVar11 && (long)pvVar11 - (long)shape != 0);
  }
  if (collide) {
    if ((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == (element_type *)0x0) {
      __assert_fail("material",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                    ,0x214,
                    "void chrono::ChBodyEasyClusterOfSpheres::SetupBody(std::vector<ChVector<>> &, std::vector<double> &, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    peVar3 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var12 = (this->super_ChBody).collision_model.
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      }
    }
    (*peVar3->_vptr_ChCollisionModel[3])();
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
    }
    if ((positions->
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
        _M_impl.super__Vector_impl_data._M_finish !=
        (positions->
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      uVar14 = 0;
      uVar15 = 1;
      do {
        peVar3 = (this->super_ChBody).collision_model.
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var12 = (this->super_ChBody).collision_model.
                  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          }
        }
        local_168 = (material->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
        p_Stack_160 = (material->
                      super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
        p_Var4 = (material->
                 super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        (*peVar3->_vptr_ChCollisionModel[5])
                  (peVar3,&local_168,
                   local_1b0.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar14);
        if (p_Stack_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_160);
        }
        if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
        }
        uVar14 = ((long)(positions->
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(positions->
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        bVar18 = uVar15 <= uVar14;
        lVar10 = uVar14 - uVar15;
        uVar14 = uVar15;
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (bVar18 && lVar10 != 0);
    }
    peVar3 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var12 = (this->super_ChBody).collision_model.
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      }
    }
    (*peVar3->_vptr_ChCollisionModel[4])();
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
    }
    shape = (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)0x1;
    ChBody::SetCollide(&this->super_ChBody,true);
  }
  if (visualize) {
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    p_Var12->_M_use_count = 1;
    p_Var12->_M_weak_count = 1;
    p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b0bf68;
    p_Var12[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var12[1]._M_use_count = 0;
    p_Var12[1]._M_weak_count = 0;
    p_Var12[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var12[2]._M_use_count = 0;
    p_Var12[2]._M_weak_count = 0;
    p_Var12[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var12[2]._M_use_count = 0;
    p_Var12[2]._M_weak_count = 0;
    p_Var12[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var12[3]._M_use_count = 0;
    p_Var12[3]._M_weak_count = 0;
    if ((positions->
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
        _M_impl.super__Vector_impl_data._M_finish !=
        (positions->
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      uVar16 = 1;
      uVar14 = 0;
      do {
        this_00 = (ChSphereShape *)ChVisualShape::operator_new((ChVisualShape *)0x38,(size_t)shape);
        ChSphereShape::ChSphereShape(this_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChSphereShape*>
                  (&local_1b8,this_00);
        (this_00->gsphere).rad =
             (radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar14];
        local_188.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._M_pi;
        if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1b8._M_pi)->_M_use_count = (local_1b8._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1b8._M_pi)->_M_use_count = (local_1b8._M_pi)->_M_use_count + 1;
          }
        }
        local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
        local_d8.m_data[0] = 1.0;
        local_d8.m_data[3] = 0.0;
        local_d8.m_data[1] = 0.0;
        local_d8.m_data[2] = 0.0;
        local_b8.coord.pos.m_data[0] =
             local_1b0.
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar14].m_data[0];
        local_b8.coord.pos.m_data[1] =
             local_1b0.
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar14].m_data[1];
        local_b8.coord.pos.m_data[2] =
             local_1b0.
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar14].m_data[2];
        local_b8.coord.rot.m_data[0] = 1.0;
        local_b8.coord.rot.m_data[3] = 0.0;
        local_b8.coord.rot.m_data[1] = 0.0;
        local_b8.coord.rot.m_data[2] = 0.0;
        local_188.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
        ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,&local_d8);
        shape = &local_188;
        ChVisualModel::AddShape
                  ((ChVisualModel *)(p_Var12 + 1),(shared_ptr<chrono::ChVisualShape> *)shape,
                   &local_b8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_188.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_188.
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8._M_pi);
        }
        uVar14 = (ulong)uVar16;
        uVar16 = uVar16 + 1;
        uVar15 = ((long)(positions->
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(positions->
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      } while (uVar14 <= uVar15 && uVar15 - uVar14 != 0);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
    }
    local_198.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ChVisualModel *)(p_Var12 + 1);
    local_198.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var12;
    ChPhysicsItem::AddVisualModel((ChPhysicsItem *)this,&local_198);
    if (local_198.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_198.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
  }
  if (local_1b0.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChBodyEasyClusterOfSpheres::SetupBody(std::vector<ChVector<>>& positions,
                                           std::vector<double>& radii,
                                           double density,
                                           bool visualize,
                                           bool collide,
                                           std::shared_ptr<ChMaterialSurface> material) {
    assert(positions.size() == radii.size());

    double totmass = 0;
    ChMatrix33<> totinertia;
    ChVector<> baricenter = VNULL;
    totinertia.setZero();
    for (unsigned int i = 0; i < positions.size(); ++i) {
        double sphmass = density * ((4.0 / 3.0) * CH_C_PI * pow(radii[i], 3));
        baricenter = (baricenter * totmass + positions[i] * sphmass) / (totmass + sphmass);
        totmass += sphmass;
    }
    for (unsigned int i = 0; i < positions.size(); ++i) {
        double sphmass = density * ((4.0 / 3.0) * CH_C_PI * pow(radii[i], 3));
        double sphinertia = (2.0 / 5.0) * sphmass * pow(radii[i], 2);

        // Huygens-Steiner parallel axis theorem:
        ChVector<> dist = positions[i] - baricenter;
        totinertia(0, 0) += sphinertia + sphmass * (dist.Length2() - dist.x() * dist.x());
        totinertia(1, 1) += sphinertia + sphmass * (dist.Length2() - dist.y() * dist.y());
        totinertia(2, 2) += sphinertia + sphmass * (dist.Length2() - dist.z() * dist.z());
        totinertia(0, 1) += sphmass * (-dist.x() * dist.y());
        totinertia(0, 2) += sphmass * (-dist.x() * dist.z());
        totinertia(1, 2) += sphmass * (-dist.y() * dist.z());
        totinertia(1, 0) = totinertia(0, 1);
        totinertia(2, 0) = totinertia(0, 2);
        totinertia(2, 1) = totinertia(1, 2);
    }

    this->SetDensity((float)density);
    this->SetMass(totmass);
    this->SetInertia(totinertia);

    // Translate the cluster baricenter so that body origin is also baricenter
    std::vector<ChVector<>> offset_positions = positions;
    for (unsigned int i = 0; i < positions.size(); ++i)
        offset_positions[i] -= baricenter;

    if (collide) {
        assert(material);
        GetCollisionModel()->ClearModel();
        for (unsigned int i = 0; i < positions.size(); ++i) {
            GetCollisionModel()->AddSphere(material, radii[i], offset_positions[i]);  // radius, radius, height on y
        }
        GetCollisionModel()->BuildModel();
        SetCollide(true);
    }
    if (visualize) {
        auto vmodel = chrono_types::make_shared<ChVisualModel>();
        for (unsigned int i = 0; i < positions.size(); ++i) {
            auto vshape = chrono_types::make_shared<ChSphereShape>();
            vshape->GetSphereGeometry().rad = radii[i];
            vmodel->AddShape(vshape, ChFrame<>(offset_positions[i]));
        }
        this->AddVisualModel(vmodel);
    }
}